

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O0

void __thiscall adios2::core::Attribute<long>::~Attribute(Attribute<long> *this)

{
  undefined8 *in_RDI;
  vector<long,_std::allocator<long>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Attribute_0112b080;
  std::vector<long,_std::allocator<long>_>::~vector(unaff_retaddr);
  AttributeBase::~AttributeBase((AttributeBase *)0x82d984);
  return;
}

Assistant:

~Attribute() = default;